

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

int __thiscall
FOptionMenuTextField::Draw
          (FOptionMenuTextField *this,FOptionMenuDescriptor *desc,int y,int indent,bool selected)

{
  int iVar1;
  BYTE *in_RAX;
  FString text;
  FString local_38;
  
  if (this->mEntering == true) {
    local_38.Chars = (char *)in_RAX;
    (*(this->super_FOptionMenuFieldBase).super_FOptionMenuItem.super_FListMenuItem.
      _vptr_FListMenuItem[0x13])(&local_38,this);
    iVar1 = FFont::StringWidth(SmallFont,(BYTE *)local_38.Chars);
    iVar1 = (-0xe - iVar1) * CleanXfac_1 + (screen->super_DSimpleCanvas).super_DCanvas.Width;
    if (iVar1 < indent) {
      indent = iVar1;
    }
    FString::~FString(&local_38);
  }
  iVar1 = FOptionMenuFieldBase::Draw(&this->super_FOptionMenuFieldBase,desc,y,indent,selected);
  return iVar1;
}

Assistant:

int Draw(FOptionMenuDescriptor*desc, int y, int indent, bool selected)
	{
		if (mEntering)
		{
			// reposition the text so that the cursor is visible when in entering mode.
			FString text = Represent();
			int tlen = SmallFont->StringWidth(text) * CleanXfac_1;
			int newindent = screen->GetWidth() - tlen - CURSORSPACE;
			if (newindent < indent) indent = newindent;
		}
		return FOptionMenuFieldBase::Draw(desc, y, indent, selected);
	}